

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Appearance_PDU.cpp
# Opt level: O3

void __thiscall KDIS::PDU::Appearance_PDU::SetForceIDFlag(Appearance_PDU *this,KBOOL F)

{
  KUINT16 *pKVar1;
  
  if ((KBOOL)((this->m_AppearanceFlag1Union).m_ui8Flag & 1) != F) {
    (this->m_AppearanceFlag1Union).m_ui8Flag = (this->m_AppearanceFlag1Union).m_ui8Flag & 0xfe | F;
    pKVar1 = &(this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + (F - 1 | 1);
  }
  return;
}

Assistant:

void Appearance_PDU::SetForceIDFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_AppearanceFlag1Union.m_ui8ForceId )return;

    m_AppearanceFlag1Union.m_ui8ForceId = F;

    if( F )
    {
        m_ui16PDULength += 1; // 1 = Size of force id
    }
    else
    {
        m_ui16PDULength -= 1;
    }
}